

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# krunxx.cpp
# Opt level: O3

void run_acquisition(device *dev,config *c)

{
  pixels_received_handler *this;
  char cVar1;
  long lVar2;
  ostream *poVar3;
  char *__s;
  size_t sVar4;
  int __fd;
  double dVar5;
  undefined1 auVar6 [16];
  function<void_(int,_bool,_const_katherine_frame_info_&)> local_1b8;
  acquisition<katherine::acq::f_toa_tot> acq;
  
  sVar4 = 0x180000;
  katherine::base_acquisition::base_acquisition<long,std::ratio<1l,1000l>,long,std::ratio<1l,1l>>
            (&acq.super_base_acquisition,dev,0xc7ffffe,0x180000,
             (duration<long,_std::ratio<1L,_1000L>_>)0x1f4,(duration<long,_std::ratio<1L,_1L>_>)0xa,
             toa_tot,true,true);
  acq.super_base_acquisition._vptr_base_acquisition = (_func_int **)&PTR__acquisition_00106c00;
  acq.pixels_received_handler_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  acq.pixels_received_handler_.super__Function_base._M_functor._8_8_ = 0;
  acq.pixels_received_handler_._M_invoker =
       std::
       _Function_handler<void_(const_katherine_px_f_toa_tot_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/petrmanek[P]libkatherine/cxx/include/katherinexx/acquisition.hpp:245:35)>
       ::_M_invoke;
  acq.pixels_received_handler_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_katherine_px_f_toa_tot_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/petrmanek[P]libkatherine/cxx/include/katherinexx/acquisition.hpp:245:35)>
       ::_M_manager;
  acq.super_base_acquisition.acq_.handlers.pixels_received =
       katherine::acquisition<katherine::acq::f_toa_tot>::forward_pixels_received;
  local_1b8.super__Function_base._M_functor._8_8_ = 0;
  local_1b8.super__Function_base._M_functor._M_unused._M_object = frame_started;
  local_1b8._M_invoker = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
  local_1b8.super__Function_base._M_manager =
       std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
  std::function<void_(int)>::operator=
            (&acq.super_base_acquisition.frame_started_handler_,(function<void_(int)> *)&local_1b8);
  if (local_1b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1b8.super__Function_base._M_manager)
              ((_Any_data *)&local_1b8,(_Any_data *)&local_1b8,__destroy_functor);
  }
  local_1b8.super__Function_base._M_functor._8_8_ = 0;
  local_1b8.super__Function_base._M_functor._M_unused._M_object = frame_ended;
  local_1b8._M_invoker =
       std::
       _Function_handler<void_(int,_bool,_const_katherine_frame_info_&),_void_(*)(int,_bool,_const_katherine_frame_info_&)>
       ::_M_invoke;
  local_1b8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(int,_bool,_const_katherine_frame_info_&),_void_(*)(int,_bool,_const_katherine_frame_info_&)>
       ::_M_manager;
  std::function<void_(int,_bool,_const_katherine_frame_info_&)>::operator=
            (&acq.super_base_acquisition.frame_ended_handler_,&local_1b8);
  if (local_1b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1b8.super__Function_base._M_manager)
              ((_Any_data *)&local_1b8,(_Any_data *)&local_1b8,__destroy_functor);
  }
  this = &acq.pixels_received_handler_;
  local_1b8.super__Function_base._M_functor._8_8_ = 0;
  local_1b8.super__Function_base._M_functor._M_unused._M_object = pixels_received;
  local_1b8._M_invoker =
       std::
       _Function_handler<void_(const_katherine_px_f_toa_tot_*,_unsigned_long),_void_(*)(const_katherine_px_f_toa_tot_*,_unsigned_long)>
       ::_M_invoke;
  local_1b8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_katherine_px_f_toa_tot_*,_unsigned_long),_void_(*)(const_katherine_px_f_toa_tot_*,_unsigned_long)>
       ::_M_manager;
  std::function<void_(const_katherine_px_f_toa_tot_*,_unsigned_long)>::operator=
            (this,(function<void_(const_katherine_px_f_toa_tot_*,_unsigned_long)> *)&local_1b8);
  if (local_1b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1b8.super__Function_base._M_manager)
              ((_Any_data *)&local_1b8,(_Any_data *)&local_1b8,__destroy_functor);
  }
  katherine::base_acquisition::begin(&acq.super_base_acquisition,c,data_driven);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Acquisition started.",0x14);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  __fd = (int)cVar1;
  std::ostream::put('h');
  std::ostream::flush();
  auVar6 = std::chrono::_V2::steady_clock::now();
  katherine::base_acquisition::read(&acq.super_base_acquisition,__fd,auVar6._8_8_,sVar4);
  lVar2 = std::chrono::_V2::steady_clock::now();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Acquisition completed:",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - state: ",10);
  __s = (char *)katherine_str_acquisition_status((int)acq.super_base_acquisition.acq_.state);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - received ",0xc);
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,acq.super_base_acquisition.acq_.completed_frames);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," complete frames",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - dropped ",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," measurement data items",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - total hits: ",0xf);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - total duration: ",0x13);
  dVar5 = (double)((lVar2 - auVar6._0_8_) / 1000000) / 1000.0;
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," s",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - throughput: ",0xf);
  poVar3 = std::ostream::_M_insert<double>
                     ((((double)CONCAT44(0x45300000,(int)(n_hits >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)n_hits) - 4503599627370496.0)) / dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," hits/s",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  acq.super_base_acquisition._vptr_base_acquisition = (_func_int **)&PTR__acquisition_00106c00;
  if (acq.pixels_received_handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*acq.pixels_received_handler_.super__Function_base._M_manager)
              ((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  katherine::base_acquisition::~base_acquisition(&acq.super_base_acquisition);
  return;
}

Assistant:

void
run_acquisition(katherine::device& dev, const katherine::config& c)
{
    using namespace std::chrono;
    using namespace std::literals::chrono_literals;

    katherine::acquisition<mode> acq{dev, katherine::md_size * 34952533, sizeof(mode::pixel_type) * 65536, 500ms, 10s, true};

    acq.set_frame_started_handler(frame_started);
    acq.set_frame_ended_handler(frame_ended);
    acq.set_pixels_received_handler(pixels_received);

    acq.begin(c, katherine::readout_type::data_driven);
    std::cerr << "Acquisition started." << std::endl;

    auto tic = steady_clock::now();
    acq.read();
    auto toc = steady_clock::now();

    double duration = duration_cast<milliseconds>(toc - tic).count() / 1000.;
    std::cerr << std::endl;
    std::cerr << "Acquisition completed:" << std::endl
                << " - state: " << katherine::str_acq_state(acq.state()) << std::endl
                << " - received " << acq.completed_frames() << " complete frames" << std::endl
                << " - dropped " << acq.dropped_measurement_data() << " measurement data items" << std::endl
                << " - total hits: " << n_hits << std::endl
                << " - total duration: " << duration << " s" << std::endl
                << " - throughput: " << (n_hits / duration) << " hits/s" << std::endl;
}